

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O2

void duckdb_mbedtls::MbedTlsWrapper::ComputeSha256Hash(char *in,size_t in_len,char *out)

{
  int iVar1;
  runtime_error *this;
  mbedtls_sha256_context sha_context;
  
  mbedtls_sha256_init(&sha_context);
  iVar1 = mbedtls_sha256_starts(&sha_context,0);
  if (iVar1 == 0) {
    iVar1 = mbedtls_sha256_update(&sha_context,(uchar *)in,in_len);
    if (iVar1 == 0) {
      iVar1 = mbedtls_sha256_finish(&sha_context,(uchar *)out);
      if (iVar1 == 0) {
        mbedtls_sha256_free(&sha_context);
        return;
      }
    }
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"SHA256 Error");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MbedTlsWrapper::ComputeSha256Hash(const char *in, size_t in_len, char *out) {

	mbedtls_sha256_context sha_context;
	mbedtls_sha256_init(&sha_context);
	if (mbedtls_sha256_starts(&sha_context, false) ||
	    mbedtls_sha256_update(&sha_context, reinterpret_cast<const unsigned char *>(in), in_len) ||
	    mbedtls_sha256_finish(&sha_context, reinterpret_cast<unsigned char *>(out))) {
		throw runtime_error("SHA256 Error");
	}
	mbedtls_sha256_free(&sha_context);
}